

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool AmpIO::WriteEncoderPreloadAll(BasePort *port,int32_t sdata)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  bVar5 = 1;
  uVar4 = 0;
  do {
    uVar3 = uVar4 << 4 | 4;
    do {
      if (uVar4 == 8) {
LAB_0010616c:
        return (bool)(7 < uVar4 & bVar5);
      }
      if (0xffffff < sdata + 0x800000U) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "AmpIO::WriteEncoderPreloadAll, preload out of range ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sdata);
        std::endl<char,std::char_traits<char>>(poVar2);
        bVar5 = 1;
        goto LAB_0010616c;
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 0x10;
    } while (port == (BasePort *)0x0);
    iVar1 = (*port->_vptr_BasePort[0x24])(port,0x3f,uVar3,(ulong)(sdata + 0x800000U));
    bVar5 = bVar5 != 0 & (byte)iVar1;
  } while( true );
}

Assistant:

bool AmpIO::WriteEncoderPreloadAll(BasePort *port, int32_t sdata)
{
    bool ret = true;
    for (size_t index = 0; index < 8; ++index) {
        unsigned int channel = (index+1) << 4;

        if ((sdata >= ENC_MIDRANGE) || (sdata < -ENC_MIDRANGE)) {
            std::cerr << "AmpIO::WriteEncoderPreloadAll, preload out of range " << sdata << std::endl;
            return false;
        }
        // Cannot use NumEncoders below because this is a static method
        if (port && (index < MAX_CHANNELS)) {
            ret &= port->WriteQuadlet(FW_NODE_BROADCAST, channel | ENC_LOAD_REG,
                                      static_cast<uint32_t>(sdata + ENC_MIDRANGE));
        }
    }
    return ret;
}